

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O1

void __thiscall
cmExportBuildFileGenerator::GetTargets
          (cmExportBuildFileGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *targets)

{
  pointer ppcVar1;
  
  if (this->ExportSet != (cmExportSet *)0x0) {
    for (ppcVar1 = (this->ExportSet->TargetExports).
                   super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppcVar1 !=
        (this->ExportSet->TargetExports).
        super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppcVar1 = ppcVar1 + 1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(targets,&(*ppcVar1)->TargetName);
    }
    return;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(targets,&this->Targets);
  return;
}

Assistant:

void cmExportBuildFileGenerator::GetTargets(
  std::vector<std::string>& targets) const
{
  if (this->ExportSet) {
    for (std::vector<cmTargetExport*>::const_iterator tei =
           this->ExportSet->GetTargetExports()->begin();
         tei != this->ExportSet->GetTargetExports()->end(); ++tei) {
      targets.push_back((*tei)->TargetName);
    }
    return;
  }
  targets = this->Targets;
}